

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O2

void __thiscall tst_helpers_connect::rejectOneSenderNoArg(tst_helpers_connect *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QString>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar3;
  char cVar4;
  bool bVar5;
  QThread *p_00;
  QObject *pQVar6;
  QEvent *this_00;
  PromiseData<QString> *pPVar7;
  PromiseDataBase<void,_void_()> *this_01;
  char *reject;
  bool result;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_168;
  PromiseResolver<QString> resolver_2;
  _Any_data local_158;
  undefined **local_148;
  PromiseData<QString> *local_140;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_138;
  PromiseResolver<void> resolver_1;
  QPromise<QString> p_1;
  bool local_109;
  QPromiseBase<void> local_108;
  QPromiseBase<QString> local_f8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_e8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_e0;
  PromiseResolver<QString> resolver;
  PromiseFromSignal<void_(Object::*)(const_QString_&)> p;
  QPromiseBase<QString> local_a8;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  QPromiseConnections local_78;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  Object sender;
  
  Object::Object(&sender);
  p_00 = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&local_158,p_00);
  if ((((Data *)local_158._M_unused._0_8_ != (Data *)0x0) &&
      ((PromiseData<QString> *)local_158._8_8_ != (PromiseData<QString> *)0x0 &&
       *(int *)(local_158._M_unused._M_function_pointer + 4) != 0)) &&
     (cVar4 = QThread::isFinished(), cVar4 == '\0')) {
    if (((Data *)local_158._M_unused._0_8_ == (Data *)0x0) ||
       (*(int *)(local_158._M_unused._M_function_pointer + 4) == 0)) {
      local_158._8_8_ = (PromiseData<QString> *)0x0;
    }
    pQVar6 = (QObject *)QAbstractEventDispatcher::instance((QThread *)local_158._8_8_);
    if ((pQVar6 != (QObject *)0x0) || (cVar4 = QCoreApplication::closingDown(), cVar4 == '\0')) {
      this_00 = (QEvent *)operator_new(0x18);
      QEvent::QEvent(this_00,None);
      *(undefined ***)this_00 = &PTR__Event_00127388;
      *(Object **)(this_00 + 0x10) = &sender;
      QCoreApplication::postEvent(pQVar6,this_00,0);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_158);
  p.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127710;
  pPVar7 = (PromiseData<QString> *)operator_new(0x68);
  (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar7->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.size = 0;
  (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.size = 0;
  (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_settled = 0;
  (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData
       = 0;
  (pPVar7->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QString>::PromiseData(pPVar7);
  LOCK();
  pQVar1 = &(pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar7 != (PromiseData<QString> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_158._M_unused._M_object = &PTR__QPromiseBase_00127930;
  local_158._8_8_ = pPVar7;
  p.super_QPromiseBase<QString>.m_d.d = pPVar7;
  QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
            (&resolver,(QPromise<QString> *)&local_158);
  QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&local_158);
  if (resolver.m_d.d == (Data *)0x0) {
    local_98._M_unused._M_object = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_98._M_unused._0_8_ = (undefined8)resolver;
  }
  local_68._M_unused._M_object = (undefined8 *)0x0;
  if ((Data *)local_98._M_unused._0_8_ == (Data *)0x0) {
    resolver_1.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_98._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_98._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    resolver_1.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
         local_98._M_unused._0_8_;
  }
  p_1.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)0x0;
  std::make_shared<QtPromise::QPromiseConnections::Data>();
  QtPromisePrivate::connectSignalToResolver<QString,Object,void(Object::*)(QString_const&)>
            (&local_78,(QPromiseResolve<QString> *)&local_98,&sender,0x117222);
  QtPromisePrivate::connectSignalToResolver<QString,Object,void(Object::*)()>
            (&local_78,(QPromiseReject<void> *)&resolver_1,&sender,0x117212);
  QtPromisePrivate::connectDestroyedToReject<QString,Object>
            (&local_78,(QPromiseReject<void> *)&resolver_1,&sender);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.m_d.
              super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)&p_1)
  ;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             &local_98);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             &local_68);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  p.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127930;
  local_158._M_pod_data[0] = 0 < sender.m_connections;
  resolver.m_d.d._0_1_ = 1;
  bVar5 = QTest::qCompare<bool,bool>
                    ((bool *)local_158._M_pod_data,(bool *)&resolver,"sender.hasConnections()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0x5e);
  if (bVar5) {
    bVar5 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isPending
                      (&(p.super_QPromiseBase<QString>.m_d.d)->
                        super_PromiseDataBase<QString,_void_(const_QString_&)>);
    local_158._M_pod_data[0] = bVar5;
    resolver.m_d.d._0_1_ = 1;
    reject = 
    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
    ;
    bVar5 = QTest::qCompare<bool,bool>
                      ((bool *)local_158._M_pod_data,(bool *)&resolver,"p.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                       ,0x5f);
    if (bVar5) {
      result = false;
      p_1.super_QPromiseBase<QString>.m_d = p.super_QPromiseBase<QString>.m_d;
      if (p.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0) {
        LOCK();
        pQVar1 = &((p.super_QPromiseBase<QString>.m_d.d)->
                  super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      p_1.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127930
      ;
      local_108._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001276e0;
      this_01 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
      (this_01->m_catchers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (this_01->m_catchers).d.size = 0;
      (this_01->m_handlers).d.size = 0;
      (this_01->m_catchers).d.d = (Data *)0x0;
      (this_01->m_handlers).d.d = (Data *)0x0;
      (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
      *(undefined8 *)&this_01->m_lock = 0;
      *(undefined8 *)&this_01->m_settled = 0;
      ((PromiseDataBase<void,_void_()> *)&this_01->_vptr_PromiseDataBase)->_vptr_PromiseDataBase =
           (_func_int **)0x0;
      *(undefined8 *)&this_01->super_QSharedData = 0;
      (this_01->m_error).m_data._M_exception_object = (void *)0x0;
      QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_01);
      LOCK();
      (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
           ._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (this_01 != (PromiseDataBase<void,_void_()> *)0x0) {
        LOCK();
        (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      resolver.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)
           &PTR__QPromiseBase_00127770;
      local_108.m_d.d = (PromiseData<void> *)this_01;
      QtPromisePrivate::PromiseResolver<void>::PromiseResolver
                (&resolver_1,(QPromise<void> *)&resolver);
      QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&resolver);
      QVar2 = p_1.super_QPromiseBase<QString>.m_d;
      if (resolver_1.m_d.d == (Data *)0x0) {
        local_158._M_unused._M_object = (Data *)0x0;
      }
      else {
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
        UNLOCK();
        local_158._M_unused._0_8_ = (undefined8)resolver_1;
      }
      resolver_2.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)
           (Data *)0x0;
      if ((Data *)local_158._M_unused._0_8_ == (Data *)0x0) {
        local_168.d = (Data *)0x0;
      }
      else {
        LOCK();
        *(int *)&((QPromiseBase<void> *)&((Data *)local_158._M_unused._0_8_)->super_QSharedData)->
                 _vptr_QPromiseBase =
             *(int *)&((QPromiseBase<void> *)&((Data *)local_158._M_unused._0_8_)->super_QSharedData
                      )->_vptr_QPromiseBase + 1;
        UNLOCK();
        local_168.d = (Data *)local_158._M_unused._0_8_;
      }
      local_138.d = (Data *)0x0;
      if ((Data *)local_158._M_unused._0_8_ != (Data *)0x0) {
        LOCK();
        *(int *)&((QPromiseBase<void> *)&((Data *)local_158._M_unused._0_8_)->super_QSharedData)->
                 _vptr_QPromiseBase =
             *(int *)&((QPromiseBase<void> *)&((Data *)local_158._M_unused._0_8_)->super_QSharedData
                      )->_vptr_QPromiseBase + 1;
        UNLOCK();
      }
      if ((PromiseData<QString> *)local_168.d != (PromiseData<QString> *)0x0) {
        LOCK();
        *(int *)&(((PromiseData<QString> *)local_168.d)->
                 super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase =
             *(int *)&(((PromiseData<QString> *)local_168.d)->
                      super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase
             + 1;
        UNLOCK();
      }
      local_88 = (code *)0x0;
      pcStack_80 = (code *)0x0;
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_158._8_8_ = local_168.d;
      local_f8._vptr_QPromiseBase = (_func_int **)local_158._M_unused._0_8_;
      local_98._M_unused._M_object = operator_new(0x18);
      *(void **)local_98._M_unused._0_8_ = local_158._M_unused._M_object;
      if ((Data *)local_158._M_unused._0_8_ != (Data *)0x0) {
        LOCK();
        *(int *)local_158._M_unused._0_8_ = *local_158._M_unused._M_object + 1;
        UNLOCK();
      }
      ((Data *)local_98._M_unused._0_8_)->promise = (QPromise<QString> *)local_158._8_8_;
      if ((PromiseData<QString> *)local_158._8_8_ != (PromiseData<QString> *)0x0) {
        LOCK();
        *(int *)local_158._8_8_ = *(int *)local_158._8_8_ + 1;
        UNLOCK();
      }
      pcStack_80 = std::
                   _Function_handler<void_(const_QString_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                   ::_M_invoke;
      local_88 = std::
                 _Function_handler<void_(const_QString_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_manager;
      QtPromisePrivate::
      PromiseHandler<QString,QtPromise::QPromiseBase<QString>::tapFail<waitForRejected<QtPromise::QPromiseUndefinedException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda(QString_const&)#1}(QtPromise::QPromiseUndefinedException_const&)#1}>(waitForRejected<QtPromise::QPromiseUndefinedException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda(QString_const&)#1}(QtPromise::QPromiseUndefinedException_const&)#1})const::{lambda(QString_const&)#1}()#1},void>
      ::
      create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromiseBase<QString>::tapFail<waitForRejected<QtPromise::QPromiseUndefinedException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda(QString_const&)#1}(QtPromise::QPromiseUndefinedException_const&)#1}>(waitForRejected<QtPromise::QPromiseUndefinedException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda(QString_const&)#1}(QtPromise::QPromiseUndefinedException_const&)#1})const::{lambda(QString_const&)#1}()#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
      ::{lambda(QString_const&)#1}::~function((_lambda_QString_const___1_ *)&local_158);
      QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::addHandler
                (&(QVar2.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>,
                 (function<void_(const_QString_&)> *)&local_98);
      std::_Function_base::~_Function_base((_Function_base *)&local_98);
      QVar2 = p_1.super_QPromiseBase<QString>.m_d;
      local_158._M_unused._M_object = local_f8._vptr_QPromiseBase;
      if ((Data *)local_f8._vptr_QPromiseBase != (Data *)0x0) {
        LOCK();
        *(int *)&((QPromiseBase<void> *)local_f8._vptr_QPromiseBase)->_vptr_QPromiseBase =
             *(int *)&((QPromiseBase<void> *)local_f8._vptr_QPromiseBase)->_vptr_QPromiseBase + 1;
        UNLOCK();
      }
      local_158._8_8_ = local_168.d;
      if ((PromiseData<QString> *)local_168.d != (PromiseData<QString> *)0x0) {
        LOCK();
        *(int *)&((PromiseDataBase<QString,_void_(const_QString_&)> *)
                 &(local_168.d)->super_QSharedData)->_vptr_PromiseDataBase =
             *(int *)&((PromiseDataBase<QString,_void_(const_QString_&)> *)
                      &(local_168.d)->super_QSharedData)->_vptr_PromiseDataBase + 1;
        UNLOCK();
      }
      local_148 = (undefined **)&result;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_68._M_unused._M_object = operator_new(0x18);
      *(void **)local_68._M_unused._0_8_ = local_158._M_unused._M_object;
      if ((Data *)local_158._M_unused._0_8_ != (Data *)0x0) {
        LOCK();
        *(int *)local_158._M_unused._0_8_ = *local_158._M_unused._M_object + 1;
        UNLOCK();
      }
      *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = local_158._8_8_;
      if ((PromiseData<QString> *)local_158._8_8_ != (PromiseData<QString> *)0x0) {
        LOCK();
        *(int *)local_158._8_8_ = *(int *)local_158._8_8_ + 1;
        UNLOCK();
      }
      *(undefined ***)((long)local_68._M_unused._0_8_ + 0x10) = local_148;
      pcStack_50 = std::
                   _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_manager;
      QtPromisePrivate::
      PromiseCatcher<QString,waitForRejected<QtPromise::QPromiseUndefinedException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QtPromise::QPromiseUndefinedException_const&)#1},QtPromise::QPromiseUndefinedException_const&>
      ::
      create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(waitForRejected<QtPromise::QPromiseUndefinedException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QtPromise::QPromiseUndefinedException_const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
      ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
                ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&local_158);
      QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::addCatcher
                (&(QVar2.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>,
                 (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_68);
      std::_Function_base::~_Function_base((_Function_base *)&local_68);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
                 &local_168);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
                 &local_138);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
                 &local_f8);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
                 &resolver_2);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&resolver_1.m_d);
      local_108._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127770;
      bVar5 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isPending
                        (&(p_1.super_QPromiseBase<QString>.m_d.d)->
                          super_PromiseDataBase<QString,_void_(const_QString_&)>);
      if (!bVar5) {
        QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::dispatch
                  (&(p_1.super_QPromiseBase<QString>.m_d.d)->
                    super_PromiseDataBase<QString,_void_(const_QString_&)>);
      }
      local_f8.m_d.d = p_1.super_QPromiseBase<QString>.m_d.d;
      if (p_1.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0) {
        LOCK();
        pQVar1 = &((p_1.super_QPromiseBase<QString>.m_d.d)->
                  super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_f8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127930;
      local_a8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127710;
      pPVar7 = (PromiseData<QString> *)operator_new(0x68);
      (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_error.m_data.
      _M_exception_object = (void *)0x0;
      (pPVar7->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.size = 0;
      (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.size = 0;
      (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.d = (Data *)0x0;
      (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.d = (Data *)0x0;
      (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
      *(undefined8 *)&(pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_lock = 0;
      *(undefined8 *)&(pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_settled = 0
      ;
      (pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase =
           (_func_int **)0x0;
      *(undefined8 *)
       &(pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData = 0;
      (pPVar7->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      QtPromisePrivate::PromiseData<QString>::PromiseData(pPVar7);
      LOCK();
      pQVar1 = &(pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (pPVar7 != (PromiseData<QString> *)0x0) {
        LOCK();
        pQVar1 = &(pPVar7->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData
        ;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
           &PTR__QPromiseBase_00127930;
      local_a8.m_d.d = pPVar7;
      QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
                (&resolver_2,(QPromise<QString> *)&resolver_1);
      QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&resolver_1);
      QVar3.d = local_108.m_d.d;
      if (resolver_2.m_d.d == (Data *)0x0) {
        local_168.d = (Data *)0x0;
      }
      else {
        LOCK();
        *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
        UNLOCK();
        local_168 = resolver_2.m_d.d;
      }
      local_138.d = (Data *)0x0;
      if ((PromiseData<QString> *)local_168.d == (PromiseData<QString> *)0x0) {
        local_158._8_8_ = (PromiseData<QString> *)0x0;
      }
      else {
        LOCK();
        *(int *)&((PromiseDataBase<QString,_void_(const_QString_&)> *)
                 &(local_168.d)->super_QSharedData)->_vptr_PromiseDataBase =
             *(int *)&((PromiseDataBase<QString,_void_(const_QString_&)> *)
                      &(local_168.d)->super_QSharedData)->_vptr_PromiseDataBase + 1;
        UNLOCK();
        local_158._8_8_ = local_168.d;
      }
      local_e8.d = (Data *)0x0;
      if ((PromiseData<QString> *)local_168.d != (PromiseData<QString> *)0x0) {
        LOCK();
        *(int *)&((PromiseDataBase<QString,_void_(const_QString_&)> *)
                 &(local_168.d)->super_QSharedData)->_vptr_PromiseDataBase =
             *(int *)&((PromiseDataBase<QString,_void_(const_QString_&)> *)
                      &(local_168.d)->super_QSharedData)->_vptr_PromiseDataBase + 1;
        UNLOCK();
      }
      if ((PromiseData<QString> *)local_158._8_8_ != (PromiseData<QString> *)0x0) {
        LOCK();
        *(int *)&(((PromiseData<QString> *)local_158._8_8_)->
                 super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase =
             *(int *)&(((PromiseData<QString> *)local_158._8_8_)->
                      super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase
             + 1;
        UNLOCK();
      }
      local_140 = local_f8.m_d.d;
      if (local_f8.m_d.d != (PromiseData<QString> *)0x0) {
        LOCK();
        pQVar1 = &((local_f8.m_d.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>).
                  super_QSharedData;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_148 = &PTR__QPromiseBase_00127930;
      resolver.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)
           (Data *)0x0;
      local_158._M_unused._0_8_ = local_168.d;
      local_e0.d = (Data *)local_158._8_8_;
      resolver.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)
           operator_new(0x20);
      *(void **)resolver.m_d.d = local_158._M_unused._M_object;
      if ((PromiseData<QString> *)local_158._M_unused._0_8_ != (PromiseData<QString> *)0x0) {
        LOCK();
        *(int *)local_158._M_unused._0_8_ = *local_158._M_unused._M_object + 1;
        UNLOCK();
      }
      ((Data *)resolver.m_d.d)->promise = (QPromise<QString> *)local_158._8_8_;
      if ((PromiseData<QString> *)local_158._8_8_ != (PromiseData<QString> *)0x0) {
        LOCK();
        *(int *)local_158._8_8_ = *(int *)local_158._8_8_ + 1;
        UNLOCK();
      }
      *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_00127710;
      ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<QString> *)local_140;
      if (local_140 != (PromiseData<QString> *)0x0) {
        LOCK();
        pQVar1 = &(local_140->super_PromiseDataBase<QString,_void_(const_QString_&)>).
                  super_QSharedData;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_00127930;
      QtPromisePrivate::
      PromiseHandler<void,QtPromise::QPromiseBase<QString>::tapFail<waitForRejected<QtPromise::QPromiseUndefinedException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda()#1}(QtPromise::QPromiseUndefinedException_const&)#1}>(waitForRejected<QtPromise::QPromiseUndefinedException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda()#1}(QtPromise::QPromiseUndefinedException_const&)#1})const::{lambda()#1}()#2},void>
      ::
      create<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(QtPromise::QPromiseBase<QString>::tapFail<waitForRejected<QtPromise::QPromiseUndefinedException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda()#1}(QtPromise::QPromiseUndefinedException_const&)#1}>(waitForRejected<QtPromise::QPromiseUndefinedException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::{lambda()#1}(QtPromise::QPromiseUndefinedException_const&)#1})const::{lambda()#1}()#2}const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)
      ::{lambda()#1}::~function((_lambda___1_ *)&local_158);
      QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
                (&(QVar3.d)->super_PromiseDataBase<void,_void_()>,(function<void_()> *)&resolver);
      std::_Function_base::~_Function_base((_Function_base *)&resolver);
      QVar3.d = local_108.m_d.d;
      QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
      create<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>
                ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_158,
                 (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_168,
                 (QPromiseResolve<QString> *)&local_e0,(QPromiseReject<void> *)reject);
      QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
                (&(QVar3.d)->super_PromiseDataBase<void,_void_()>,
                 (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_158);
      std::_Function_base::~_Function_base((_Function_base *)&local_158);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
      ~QExplicitlySharedDataPointer(&local_e0);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
      ~QExplicitlySharedDataPointer(&local_e8);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
      ~QExplicitlySharedDataPointer(&local_168);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
      ~QExplicitlySharedDataPointer(&local_138);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
      ~QExplicitlySharedDataPointer(&resolver_2.m_d);
      local_a8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127930;
      bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                        (&(local_108.m_d.d)->super_PromiseDataBase<void,_void_()>);
      if (!bVar5) {
        QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
                  (&(local_108.m_d.d)->super_PromiseDataBase<void,_void_()>);
      }
      QtPromise::QPromiseBase<QString>::~QPromiseBase(&local_f8);
      QtPromise::QPromiseBase<void>::~QPromiseBase(&local_108);
      QtPromise::QPromiseBase<QString>::~QPromiseBase(&p_1.super_QPromiseBase<QString>);
      QtPromise::QPromiseBase<QString>::wait((QPromiseBase<QString> *)&resolver_1,&local_a8);
      QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&resolver_1);
      QtPromise::QPromiseBase<QString>::~QPromiseBase(&local_a8);
      local_109 = result;
      resolver_1.m_d.d._0_1_ = 1;
      bVar5 = QTest::qCompare<bool,bool>
                        (&local_109,(bool *)&resolver_1,
                         "waitForRejected<QtPromise::QPromiseUndefinedException>(p)","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                         ,0x60);
      if (bVar5) {
        resolver_1.m_d.d._0_1_ = 0 < sender.m_connections;
        p_1.super_QPromiseBase<QString>._vptr_QPromiseBase =
             (_func_int **)
             ((ulong)p_1.super_QPromiseBase<QString>._vptr_QPromiseBase & 0xffffffffffffff00);
        QTest::qCompare<bool,bool>
                  ((bool *)&resolver_1,(bool *)&p_1,"sender.hasConnections()","false",
                   "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                   ,0x61);
      }
    }
  }
  QtPromise::QPromiseBase<QString>::~QPromiseBase(&p.super_QPromiseBase<QString>);
  QObject::~QObject(&sender.super_QObject);
  return;
}

Assistant:

void tst_helpers_connect::rejectOneSenderNoArg()
{
    Object sender;
    QtPromisePrivate::qtpromise_defer([&]() {
        Q_EMIT sender.noArgSignal();
    });

    auto p = QtPromise::connect(&sender, &Object::oneArgSignal, &Object::noArgSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));
    QCOMPARE(sender.hasConnections(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForRejected<QtPromise::QPromiseUndefinedException>(p), true);
    QCOMPARE(sender.hasConnections(), false);
}